

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::Mine::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Mine *this)

{
  pointer puVar1;
  _Base_ptr p_Var2;
  KBOOL KVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  KCHAR8 in_CL;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  pointer puVar8;
  KStringStream ss;
  KString local_208;
  KString local_1e8;
  KString *local_1c8;
  _Rb_tree_node_base *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Mine:",5);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n\tLocation: ",0xc);
  Vector::GetAsString_abi_cxx11_(&local_208,&this->m_Loc);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\tID: ",6);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  KVar3 = MinefieldDataFilter::IsGroundBurialDepthOffset(&this->super_MinefieldDataFilter);
  if (KVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tGround Burial Offset: ",0x17);
    poVar4 = std::ostream::_M_insert<double>((double)(float)this->m_f32GrndOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  KVar3 = MinefieldDataFilter::IsWaterBurialDepthOffset(&this->super_MinefieldDataFilter);
  if (KVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tWater Burial Offset: ",0x16);
    poVar4 = std::ostream::_M_insert<double>((double)(float)this->m_f32WtrOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  KVar3 = MinefieldDataFilter::IsSnowBurialDepthOffset(&this->super_MinefieldDataFilter);
  if (KVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tSnow Burial Offset: ",0x15);
    poVar4 = std::ostream::_M_insert<double>((double)(float)this->m_f32SnwOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  KVar3 = MinefieldDataFilter::IsMineOrientation(&this->super_MinefieldDataFilter);
  if (KVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tOrientation: ",0xe);
    EulerAngles::GetAsString_abi_cxx11_(&local_208,&this->m_Ori);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
  }
  KVar3 = MinefieldDataFilter::IsThermalContrast(&this->super_MinefieldDataFilter);
  if (KVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tThermal Contrast: ",0x13);
    poVar4 = std::ostream::_M_insert<double>((double)(float)this->m_f32ThrmCont);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  KVar3 = MinefieldDataFilter::IsReflectance(&this->super_MinefieldDataFilter);
  if (KVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tReflectance: ",0xe);
    poVar4 = std::ostream::_M_insert<double>((double)(float)this->m_f32Rflt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  KVar3 = MinefieldDataFilter::IsMineEmplacementAge(&this->super_MinefieldDataFilter);
  if (KVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tMine Emplacement Age:\n",0x17);
    ClockTime::GetAsString_abi_cxx11_(&local_1e8,&this->m_MET);
    UTILS::IndentString(&local_208,&local_1e8,2,in_CL);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  KVar3 = MinefieldDataFilter::IsFusing(&this->super_MinefieldDataFilter);
  if (KVar3) {
    MineFusing::GetAsString_abi_cxx11_(&local_1e8,&this->m_MF);
    UTILS::IndentString(&local_208,&local_1e8,1,in_CL);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  KVar3 = MinefieldDataFilter::IsScalarDetectionCoefficient(&this->super_MinefieldDataFilter);
  if (KVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"\tScalar Detection Coefficients:\n",0x20);
    puVar1 = (this->m_vui8SDC).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (puVar8 = (this->m_vui8SDC).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\t\t",2);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    }
  }
  KVar3 = MinefieldDataFilter::IsPaintScheme(&this->super_MinefieldDataFilter);
  if (KVar3) {
    MinePaintScheme::GetAsString_abi_cxx11_(&local_1e8,&this->m_MPS);
    UTILS::IndentString(&local_208,&local_1e8,1,in_CL);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  KVar3 = MinefieldDataFilter::IsTripDetonationWire(&this->super_MinefieldDataFilter);
  if (KVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tNumber Trip/Det Wires: ",0x18);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    p_Var5 = (this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(this->m_mvVertices)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var6) {
      local_1c0 = &p_Var6->_M_header;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tNumber Of Vertices: ",0x15);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        p_Var2 = p_Var5[1]._M_left;
        for (p_Var7 = p_Var5[1]._M_parent; p_Var7 != p_Var2; p_Var7 = (_Base_ptr)&p_Var7->_M_right)
        {
          (**(code **)(*(long *)p_Var7 + 0x10))(&local_1e8,p_Var7);
          UTILS::IndentString(&local_208,&local_1e8,2,in_CL);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != local_1c0);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_1c8;
}

Assistant:

KString Mine::GetAsString() const
{
    KStringStream ss;

    ss << "Mine:"
       << "\n\tLocation: " << m_Loc.GetAsString()
       << "\n\tID: "       << m_ui16ID
       << "\n";

    if( IsGroundBurialDepthOffset() )
    {
        ss << "\tGround Burial Offset: " << m_f32GrndOffset << "\n";
    }

    if( IsWaterBurialDepthOffset() )
    {
        ss << "\tWater Burial Offset: " << m_f32WtrOffset << "\n";
    }

    if( IsSnowBurialDepthOffset() )
    {
        ss << "\tSnow Burial Offset: " << m_f32SnwOffset << "\n";
    }

    if( IsMineOrientation() )
    {
        ss << "\tOrientation: " << m_Ori.GetAsString();
    }

    if( IsThermalContrast() )
    {
        ss << "\tThermal Contrast: " << m_f32ThrmCont << "\n";
    }

    if( IsReflectance() )
    {
        ss << "\tReflectance: " << m_f32Rflt << "\n";
    }

    if( IsMineEmplacementAge() )
    {
        ss << "\tMine Emplacement Age:\n" << IndentString( m_MET.GetAsString(), 2 );
    }

    if( IsFusing() )
    {
        ss << IndentString( m_MF.GetAsString(), 1 );
    }

    if( IsScalarDetectionCoefficient() )
    {
        ss << "\tScalar Detection Coefficients:\n";
        vector<KUINT8>::const_iterator citr = m_vui8SDC.begin();
        vector<KUINT8>::const_iterator citrEnd = m_vui8SDC.end();
        for( ; citr != citrEnd; ++citr )
        {
            ss << "\t\t" << ( KUINT16 )*citr << "\n";
        }
    }

    if( IsPaintScheme() )
    {
        ss << IndentString( m_MPS.GetAsString(), 1 );
    }

    if( IsTripDetonationWire() )
    {
        ss << "\tNumber Trip/Det Wires: " << ( KUINT16 )m_ui8NumTrpDetWrs << "\n";

        map< KUINT16, vector<Vector> >::const_iterator citrM = m_mvVertices.begin();
        map< KUINT16, vector<Vector> >::const_iterator citrMEnd = m_mvVertices.end();
        for( ; citrM != citrMEnd; ++citrM )
        {
            ss << "\tNumber Of Vertices: " << citrM->second.size() << "\n";

            vector<Vector>::const_iterator citrV = citrM->second.begin();
            vector<Vector>::const_iterator citrVEnd = citrM->second.end();
            for( ; citrV != citrVEnd; ++citrV )
            {
                ss << IndentString( citrV->GetAsString(), 2 );
            }
        }
    }

    return ss.str();
}